

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::CONFIGURE_WORKFLOW_STEP_NOT_FIRST(string *stepName,cmJSONState *state)

{
  string local_30;
  
  cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[25]>
            (&local_30,(char (*) [26])"Configure workflow step \"",stepName,
             (char (*) [25])"\" must be the first step");
  cmJSONState::AddError(state,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CONFIGURE_WORKFLOW_STEP_NOT_FIRST(const std::string& stepName,
                                       cmJSONState* state)
{
  state->AddError(cmStrCat("Configure workflow step \"", stepName,
                           "\" must be the first step"));
}